

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scl.c
# Opt level: O0

int Scl_CommandBuffer(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pAVar3;
  char *pcVar4;
  float local_70;
  int c;
  Abc_Ntk_t *pNtk;
  Abc_Ntk_t *pNtkRes;
  SC_BusPars *pPars;
  uint local_48;
  SC_BusPars Pars;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Pars._28_8_ = argv;
  pAVar3 = Abc_FrameReadNtk(pAbc);
  memset((SC_BusPars *)((long)&pPars + 4),0,0x24);
  pPars._4_4_ = 300;
  if (pAbc->pLibScl == (void *)0x0) {
    local_70 = 100.0;
  }
  else {
    local_70 = Abc_SclComputeAverageSlew((SC_Lib *)pAbc->pLibScl);
  }
  local_48 = (uint)local_70;
  Pars.GainRatio = 10;
  Pars.Slew = 0;
  Pars.nDegree = 1;
  Pars.fSizeOnly = 0;
  Pars.fAddBufs = 0;
  Pars.fBufPis = 0;
  Pars.fUseWireLoads = 0;
  Extra_UtilGetoptReset();
LAB_00525c5a:
  do {
    iVar1 = Extra_UtilGetopt(argc,(char **)Pars._28_8_,"GSNsbpcvwh");
    if (iVar1 == -1) {
      if (pAVar3 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      iVar1 = Abc_NtkIsLogic(pAVar3);
      if (iVar1 == 0) {
        Abc_Print(-1,"This command can only be applied to a logic network.\n");
        return 1;
      }
      if (((Pars.Slew == 0) && (Pars.nDegree == 0)) && (pAVar3->vPhases == (Vec_Int_t *)0x0)) {
        Abc_Print(-1,"Fanin phase information is not avaiable.\n");
        return 1;
      }
      if ((pAbc->pLibScl != (void *)0x0) && (iVar1 = Abc_SclHasDelayInfo(pAbc->pLibScl), iVar1 != 0)
         ) {
        pAVar3 = Abc_SclBufferingPerform
                           (pAVar3,(SC_Lib *)pAbc->pLibScl,(SC_BusPars *)((long)&pPars + 4));
        if (pAVar3 == (Abc_Ntk_t *)0x0) {
          Abc_Print(-1,"The command has failed.\n");
          return 1;
        }
        Abc_FrameReplaceCurrentNetwork(pAbc,pAVar3);
        return 0;
      }
      Abc_Print(-1,"Library delay info is not available.\n");
      return 1;
    }
    switch(iVar1) {
    case 0x47:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-G\" should be followed by a positive integer.\n");
        goto LAB_00525f84;
      }
      pPars._4_4_ = atoi(*(char **)(Pars._28_8_ + (long)globalUtilOptind * 8));
      uVar2 = pPars._4_4_;
      break;
    default:
      goto LAB_00525f84;
    case 0x4e:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-N\" should be followed by a positive integer.\n");
        goto LAB_00525f84;
      }
      Pars.GainRatio = atoi(*(char **)(Pars._28_8_ + (long)globalUtilOptind * 8));
      uVar2 = Pars.GainRatio;
      break;
    case 0x53:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-S\" should be followed by a positive integer.\n");
        goto LAB_00525f84;
      }
      local_48 = atoi(*(char **)(Pars._28_8_ + (long)globalUtilOptind * 8));
      uVar2 = local_48;
      break;
    case 0x62:
      Pars.nDegree = Pars.nDegree ^ 1;
      goto LAB_00525c5a;
    case 99:
      Pars.fAddBufs = Pars.fAddBufs ^ 1;
      goto LAB_00525c5a;
    case 0x68:
      goto LAB_00525f84;
    case 0x70:
      Pars.fSizeOnly = Pars.fSizeOnly ^ 1;
      goto LAB_00525c5a;
    case 0x73:
      Pars.Slew = Pars.Slew ^ 1;
      goto LAB_00525c5a;
    case 0x76:
      Pars.fBufPis = Pars.fBufPis ^ 1;
      goto LAB_00525c5a;
    case 0x77:
      Pars.fUseWireLoads = Pars.fUseWireLoads ^ 1;
      goto LAB_00525c5a;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)uVar2 < 0) {
LAB_00525f84:
      fprintf((FILE *)pAbc->Err,"usage: buffer [-GSN num] [-sbpcvwh]\n");
      fprintf((FILE *)pAbc->Err,"\t           performs buffering and sizing and mapped network\n");
      fprintf((FILE *)pAbc->Err,"\t-G <num> : target gain percentage [default = %d]\n",
              (ulong)pPars._4_4_);
      fprintf((FILE *)pAbc->Err,"\t-S <num> : target slew in pisoseconds [default = %d]\n",
              (ulong)local_48);
      fprintf((FILE *)pAbc->Err,"\t-N <num> : the maximum fanout count [default = %d]\n",
              (ulong)(uint)Pars.GainRatio);
      pcVar4 = "no";
      if (Pars.Slew != 0) {
        pcVar4 = "yes";
      }
      fprintf((FILE *)pAbc->Err,"\t-s       : toggle performing only sizing [default = %s]\n",pcVar4
             );
      pcVar4 = "no";
      if (Pars.nDegree != 0) {
        pcVar4 = "yes";
      }
      fprintf((FILE *)pAbc->Err,
              "\t-b       : toggle using buffers instead of inverters [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (Pars.fSizeOnly != 0) {
        pcVar4 = "yes";
      }
      fprintf((FILE *)pAbc->Err,"\t-p       : toggle buffering primary inputs [default = %s]\n",
              pcVar4);
      pcVar4 = "no";
      if (Pars.fAddBufs != 0) {
        pcVar4 = "yes";
      }
      fprintf((FILE *)pAbc->Err,"\t-c       : toggle using wire-loads if specified [default = %s]\n"
              ,pcVar4);
      pcVar4 = "no";
      if (Pars.fBufPis != 0) {
        pcVar4 = "yes";
      }
      fprintf((FILE *)pAbc->Err,"\t-v       : toggle printing verbose information [default = %s]\n",
              pcVar4);
      pcVar4 = "no";
      if (Pars.fUseWireLoads != 0) {
        pcVar4 = "yes";
      }
      fprintf((FILE *)pAbc->Err,
              "\t-w       : toggle printing more verbose information [default = %s]\n",pcVar4);
      fprintf((FILE *)pAbc->Err,"\t-h       : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Scl_CommandBuffer( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    SC_BusPars Pars, * pPars = &Pars;
    Abc_Ntk_t * pNtkRes, * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    memset( pPars, 0, sizeof(SC_BusPars) );
    pPars->GainRatio     =  300;
    pPars->Slew          = pAbc->pLibScl ? Abc_SclComputeAverageSlew((SC_Lib *)pAbc->pLibScl) : 100;
    pPars->nDegree       =   10;
    pPars->fSizeOnly     =    0;
    pPars->fAddBufs      =    1;
    pPars->fBufPis       =    0;
    pPars->fUseWireLoads =    0;
    pPars->fVerbose      =    0;
    pPars->fVeryVerbose  =    0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "GSNsbpcvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->GainRatio = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->GainRatio < 0 ) 
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->Slew = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->Slew < 0 ) 
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nDegree = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nDegree < 0 ) 
                goto usage;
            break;
        case 's':
            pPars->fSizeOnly ^= 1;
            break;
        case 'b':
            pPars->fAddBufs ^= 1;
            break;
        case 'p':
            pPars->fBufPis ^= 1;
            break;
        case 'c':
            pPars->fUseWireLoads ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "This command can only be applied to a logic network.\n" );
        return 1;
    }
    if ( !pPars->fSizeOnly && !pPars->fAddBufs && pNtk->vPhases == NULL )
    {
        Abc_Print( -1, "Fanin phase information is not avaiable.\n" );
        return 1;
    }
    if ( !pAbc->pLibScl || !Abc_SclHasDelayInfo(pAbc->pLibScl) )
    {
        Abc_Print( -1, "Library delay info is not available.\n" );
        return 1;
    }
    // modify the current network
    pNtkRes = Abc_SclBufferingPerform( pNtk, (SC_Lib *)pAbc->pLibScl, pPars );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "The command has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: buffer [-GSN num] [-sbpcvwh]\n" );
    fprintf( pAbc->Err, "\t           performs buffering and sizing and mapped network\n" );
    fprintf( pAbc->Err, "\t-G <num> : target gain percentage [default = %d]\n", pPars->GainRatio );
    fprintf( pAbc->Err, "\t-S <num> : target slew in pisoseconds [default = %d]\n", pPars->Slew );
    fprintf( pAbc->Err, "\t-N <num> : the maximum fanout count [default = %d]\n", pPars->nDegree );
    fprintf( pAbc->Err, "\t-s       : toggle performing only sizing [default = %s]\n", pPars->fSizeOnly? "yes": "no" );
    fprintf( pAbc->Err, "\t-b       : toggle using buffers instead of inverters [default = %s]\n", pPars->fAddBufs? "yes": "no" );
    fprintf( pAbc->Err, "\t-p       : toggle buffering primary inputs [default = %s]\n", pPars->fBufPis? "yes": "no" );
    fprintf( pAbc->Err, "\t-c       : toggle using wire-loads if specified [default = %s]\n", pPars->fUseWireLoads? "yes": "no" );
    fprintf( pAbc->Err, "\t-v       : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    fprintf( pAbc->Err, "\t-w       : toggle printing more verbose information [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    fprintf( pAbc->Err, "\t-h       : print the command usage\n");
    return 1;
}